

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O2

_Bool read_byte_sign_extended(m680x_info *info,int16_t *word,uint16_t address)

{
  byte bVar1;
  ulong uVar2;
  undefined2 in_register_00000012;
  
  uVar2 = (ulong)CONCAT22(in_register_00000012,address) - (ulong)info->offset;
  if ((uint)uVar2 < info->size) {
    bVar1 = info->code[uVar2];
    uVar2 = (ulong)bVar1;
    if ((char)bVar1 < '\0') {
      uVar2 = (ulong)(bVar1 | 0xffffff00);
    }
    *word = (int16_t)uVar2;
  }
  return SUB81(uVar2,0);
}

Assistant:

static bool read_byte_sign_extended(const m680x_info *info, int16_t *word,
	uint16_t address)
{
	if (address - info->offset >= info->size)
		// out of code buffer range
		return false;

	*word = (int16_t) info->code[address - info->offset];

	if (*word & 0x80)
		*word |= 0xFF00;

	return true;
}